

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityAssertEqualStringArray
               (void *expected,char **actual,UNITY_UINT32 num_elements,char *msg,
               UNITY_UINT lineNumber,UNITY_FLAGS_T flags)

{
  char *pcVar1;
  char *pcVar2;
  char *actual_00;
  int iVar3;
  ulong uVar4;
  UNITY_UINT number;
  char *expected_00;
  
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    if (num_elements == 0) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    if ((char **)expected != actual) {
      iVar3 = UnityIsOneArrayNull(expected,actual,lineNumber,msg);
      if (iVar3 != 0) {
LAB_001026dc:
        Unity.CurrentTestFailed = 1;
        longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
      }
      expected_00 = (char *)expected;
      if (flags == UNITY_ARRAY_TO_ARRAY) {
        expected_00 = (char *)0x0;
      }
      number = 0;
      do {
        if (flags == UNITY_ARRAY_TO_ARRAY) {
          expected_00 = *(char **)((long)expected + number * 8);
        }
        actual_00 = actual[number];
        if (actual_00 == (char *)0x0 || expected_00 == (char *)0x0) {
          if (expected_00 == actual_00) goto LAB_00102683;
LAB_0010269f:
          Unity.CurrentTestFailed = 1;
LAB_001026a7:
          UnityTestResultsFailBegin(lineNumber);
          if (num_elements != 1) {
            UnityPrint(" Element ");
            UnityPrintNumberUnsigned(number);
          }
          UnityPrintExpectedAndActualStrings(expected_00,actual_00);
          UnityAddMsgIfSpecified(msg);
          goto LAB_001026dc;
        }
        uVar4 = 0;
        while( true ) {
          pcVar1 = expected_00 + uVar4;
          pcVar2 = actual_00 + uVar4;
          if (*pcVar1 == '\0' && *pcVar2 == '\0') break;
          uVar4 = (ulong)((int)uVar4 + 1);
          if (*pcVar1 != *pcVar2) goto LAB_0010269f;
        }
LAB_00102683:
        if (Unity.CurrentTestFailed != 0) {
          number = 0;
          goto LAB_001026a7;
        }
        number = number + 1;
      } while (number != num_elements);
    }
  }
  return;
}

Assistant:

void UnityAssertEqualStringArray(UNITY_INTERNAL_PTR expected,
                                 const char** actual,
                                 const UNITY_UINT32 num_elements,
                                 const char* msg,
                                 const UNITY_LINE_TYPE lineNumber,
                                 const UNITY_FLAGS_T flags)
{
    UNITY_UINT32 i = 0;
    UNITY_UINT32 j = 0;
    const char* exp = NULL;
    const char* act = NULL;

    RETURN_IF_FAIL_OR_IGNORE;

    /* if no elements, it's an error */
    if (num_elements == 0)
    {
        UnityPrintPointlessAndBail();
    }

    if ((const void*)expected == (const void*)actual)
    {
        return; /* Both are NULL or same pointer */
    }

    if (UnityIsOneArrayNull((UNITY_INTERNAL_PTR)expected, (UNITY_INTERNAL_PTR)actual, lineNumber, msg))
    {
        UNITY_FAIL_AND_BAIL;
    }

    if (flags != UNITY_ARRAY_TO_ARRAY)
    {
        exp = (const char*)expected;
    }

    do
    {
        act = actual[j];
        if (flags == UNITY_ARRAY_TO_ARRAY)
        {
            exp = ((const char* const*)expected)[j];
        }

        /* if both pointers not null compare the strings */
        if (exp && act)
        {
            for (i = 0; exp[i] || act[i]; i++)
            {
                if (exp[i] != act[i])
                {
                    Unity.CurrentTestFailed = 1;
                    break;
                }
            }
        }
        else
        { /* handle case of one pointers being null (if both null, test should pass) */
            if (exp != act)
            {
                Unity.CurrentTestFailed = 1;
            }
        }

        if (Unity.CurrentTestFailed)
        {
            UnityTestResultsFailBegin(lineNumber);
            if (num_elements > 1)
            {
                UnityPrint(UnityStrElement);
                UnityPrintNumberUnsigned(j);
            }
            UnityPrintExpectedAndActualStrings(exp, act);
            UnityAddMsgIfSpecified(msg);
            UNITY_FAIL_AND_BAIL;
        }
    } while (++j < num_elements);
}